

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

int cfg_avlcmp_keys(void *p1,void *p2)

{
  char *str2;
  char *str1;
  void *p2_local;
  void *p1_local;
  
  if (p1 == (void *)0x0) {
    p1_local._4_4_ = -1;
    if (p2 == (void *)0x0) {
      p1_local._4_4_ = 0;
    }
  }
  else if (p2 == (void *)0x0) {
    p1_local._4_4_ = 1;
  }
  else {
    p1_local._4_4_ = strcasecmp((char *)p1,(char *)p2);
  }
  return p1_local._4_4_;
}

Assistant:

int
cfg_avlcmp_keys(const void *p1, const void *p2) {
  const char *str1 = p1;
  const char *str2 = p2;

  if (str1 == NULL) {
    return str2 == NULL ? 0 : -1;
  }
  if (str2 == NULL) {
    return 1;
  }

  return strcasecmp(str1, str2);
}